

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

void __thiscall libsbox::BindRule::BindRule(BindRule *this,string *inside,string *outside)

{
  std::__cxx11::string::string((string *)this,(string *)inside);
  std::__cxx11::string::string((string *)&this->outside_,(string *)outside);
  this->flags_ = 0;
  return;
}

Assistant:

BindRule::BindRule(const std::string &inside, const std::string &outside)
    : inside_(inside), outside_(outside), flags_(0) {}